

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O2

int __thiscall zmq::router_t::xsend(router_t *this,msg_t *msg_)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  ssize_t sVar5;
  uchar *puVar6;
  out_pipe_t *poVar7;
  int *piVar8;
  char *pcVar9;
  char *errmsg_;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  EVP_PKEY_CTX *pEVar10;
  pipe_t *ppVar11;
  undefined8 uVar12;
  blob_t local_40;
  
  if (this->_more_out == false) {
    pcVar9 = (char *)msg_;
    if (this->_current_out != (pipe_t *)0x0) {
      pcVar9 = "Assertion failed: %s (%s:%d)\n";
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","!_current_out",
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0xc1);
      fflush(_stderr);
      zmq_abort("!_current_out");
    }
    bVar1 = msg_t::flags(msg_);
    if ((bVar1 & 1) != 0) {
      this->_more_out = true;
      puVar6 = (uchar *)msg_t::data(msg_);
      local_40._size = msg_t::size(msg_);
      pcVar9 = (char *)&local_40;
      local_40._owned = false;
      local_40._data = puVar6;
      poVar7 = routing_socket_base_t::lookup_out_pipe
                         (&this->super_routing_socket_base_t,(blob_t *)pcVar9);
      blob_t::~blob_t(&local_40);
      if (poVar7 == (out_pipe_t *)0x0) {
        if (this->_mandatory == true) {
          this->_more_out = false;
          piVar8 = __errno_location();
LAB_001c4a9b:
          *piVar8 = 0x71;
          return -1;
        }
      }
      else {
        ppVar11 = poVar7->pipe;
        this->_current_out = ppVar11;
        bVar2 = pipe_t::check_write(ppVar11);
        if (!bVar2) {
          bVar2 = pipe_t::check_hwm(this->_current_out);
          poVar7->active = false;
          this->_current_out = (pipe_t *)0x0;
          if (this->_mandatory == true) {
            this->_more_out = false;
            piVar8 = __errno_location();
            if (!bVar2) {
              *piVar8 = 0xb;
              return -1;
            }
            goto LAB_001c4a9b;
          }
        }
      }
    }
    iVar3 = msg_t::close(msg_,(int)pcVar9);
    if (iVar3 != 0) {
      piVar8 = __errno_location();
      errmsg_ = strerror(*piVar8);
      pcVar9 = "%s (%s:%d)\n";
      fprintf(_stderr,"%s (%s:%d)\n",errmsg_,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0xeb);
      fflush(_stderr);
      zmq_abort(errmsg_);
    }
    iVar3 = msg_t::init(msg_,(EVP_PKEY_CTX *)pcVar9);
    if (iVar3 == 0) {
      return 0;
    }
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    uVar12 = 0xed;
    goto LAB_001c4bcc;
  }
  pEVar10 = (EVP_PKEY_CTX *)msg_;
  if ((this->super_routing_socket_base_t).super_socket_base_t.super_own_t.options.raw_socket == true
     ) {
    pEVar10 = (EVP_PKEY_CTX *)0x1;
    msg_t::reset_flags(msg_,'\x01');
  }
  bVar1 = msg_t::flags(msg_);
  this->_more_out = (bool)(bVar1 & 1);
  ppVar11 = this->_current_out;
  if (ppVar11 == (pipe_t *)0x0) {
    iVar3 = msg_t::close(msg_,(int)pEVar10);
    if (iVar3 != 0) {
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      pEVar10 = (EVP_PKEY_CTX *)0x1dfbd5;
      fprintf(_stderr,"%s (%s:%d)\n",pcVar9,
              "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
              ,0x118);
      fflush(_stderr);
      zmq_abort(pcVar9);
    }
  }
  else {
    __buf = extraout_RDX;
    if (this->_raw_socket == true) {
      sVar4 = msg_t::size(msg_);
      ppVar11 = this->_current_out;
      __buf = extraout_RDX_00;
      if (sVar4 == 0) {
        pEVar10 = (EVP_PKEY_CTX *)0x0;
        pipe_t::terminate(ppVar11,false);
        iVar3 = msg_t::close(msg_,(int)pEVar10);
        if (iVar3 != 0) {
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          pEVar10 = (EVP_PKEY_CTX *)0x1dfbd5;
          fprintf(_stderr,"%s (%s:%d)\n",pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                  ,0x100);
          fflush(_stderr);
          zmq_abort(pcVar9);
        }
        iVar3 = msg_t::init(msg_,pEVar10);
        if (iVar3 != 0) {
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          fprintf(_stderr,"%s (%s:%d)\n",pcVar9,
                  "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                  ,0x102);
          fflush(_stderr);
          zmq_abort(pcVar9);
        }
        this->_current_out = (pipe_t *)0x0;
        return 0;
      }
    }
    pEVar10 = (EVP_PKEY_CTX *)msg_;
    sVar5 = pipe_t::write(ppVar11,(int)msg_,__buf,in_RCX);
    if ((char)sVar5 == '\0') {
      iVar3 = msg_t::close(msg_,(int)pEVar10);
      if (iVar3 != 0) {
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        pEVar10 = (EVP_PKEY_CTX *)0x1dfbd5;
        fprintf(_stderr,"%s (%s:%d)\n",pcVar9,
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
                ,0x10b);
        fflush(_stderr);
        zmq_abort(pcVar9);
      }
      pipe_t::rollback(this->_current_out);
    }
    else {
      if (this->_more_out != false) goto LAB_001c4a41;
      pipe_t::flush(this->_current_out);
    }
    this->_current_out = (pipe_t *)0x0;
  }
LAB_001c4a41:
  iVar3 = msg_t::init(msg_,pEVar10);
  if (iVar3 == 0) {
    return 0;
  }
  piVar8 = __errno_location();
  pcVar9 = strerror(*piVar8);
  uVar12 = 0x11d;
LAB_001c4bcc:
  fprintf(_stderr,"%s (%s:%d)\n",pcVar9,
          "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/router.cpp"
          ,uVar12);
  fflush(_stderr);
  zmq_abort(pcVar9);
  return 0;
}

Assistant:

int zmq::router_t::xsend (msg_t *msg_)
{
    //  If this is the first part of the message it's the ID of the
    //  peer to send the message to.
    if (!_more_out) {
        zmq_assert (!_current_out);

        //  If we have malformed message (prefix with no subsequent message)
        //  then just silently ignore it.
        //  TODO: The connections should be killed instead.
        if (msg_->flags () & msg_t::more) {
            _more_out = true;

            //  Find the pipe associated with the routing id stored in the prefix.
            //  If there's no such pipe just silently ignore the message, unless
            //  router_mandatory is set.
            out_pipe_t *out_pipe = lookup_out_pipe (
              blob_t (static_cast<unsigned char *> (msg_->data ()),
                      msg_->size (), zmq::reference_tag_t ()));

            if (out_pipe) {
                _current_out = out_pipe->pipe;

                // Check whether pipe is closed or not
                if (!_current_out->check_write ()) {
                    // Check whether pipe is full or not
                    const bool pipe_full = !_current_out->check_hwm ();
                    out_pipe->active = false;
                    _current_out = NULL;

                    if (_mandatory) {
                        _more_out = false;
                        if (pipe_full)
                            errno = EAGAIN;
                        else
                            errno = EHOSTUNREACH;
                        return -1;
                    }
                }
            } else if (_mandatory) {
                _more_out = false;
                errno = EHOSTUNREACH;
                return -1;
            }
        }

        int rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
        return 0;
    }

    //  Ignore the MORE flag for raw-sock or assert?
    if (options.raw_socket)
        msg_->reset_flags (msg_t::more);

    //  Check whether this is the last part of the message.
    _more_out = (msg_->flags () & msg_t::more) != 0;

    //  Push the message into the pipe. If there's no out pipe, just drop it.
    if (_current_out) {
        // Close the remote connection if user has asked to do so
        // by sending zero length message.
        // Pending messages in the pipe will be dropped (on receiving term- ack)
        if (_raw_socket && msg_->size () == 0) {
            _current_out->terminate (false);
            int rc = msg_->close ();
            errno_assert (rc == 0);
            rc = msg_->init ();
            errno_assert (rc == 0);
            _current_out = NULL;
            return 0;
        }

        const bool ok = _current_out->write (msg_);
        if (unlikely (!ok)) {
            // Message failed to send - we must close it ourselves.
            const int rc = msg_->close ();
            errno_assert (rc == 0);
            // HWM was checked before, so the pipe must be gone. Roll back
            // messages that were piped, for example REP labels.
            _current_out->rollback ();
            _current_out = NULL;
        } else {
            if (!_more_out) {
                _current_out->flush ();
                _current_out = NULL;
            }
        }
    } else {
        const int rc = msg_->close ();
        errno_assert (rc == 0);
    }

    //  Detach the message from the data buffer.
    const int rc = msg_->init ();
    errno_assert (rc == 0);

    return 0;
}